

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

xmlRelaxNGDefinePtr_conflict *
xmlRelaxNGGetElements(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict def,int eora)

{
  xmlRelaxNGDefinePtr *ppxVar1;
  xmlRelaxNGType xVar2;
  xmlRelaxNGDefinePtr pxVar3;
  xmlRelaxNGDefinePtr_conflict *ppxVar4;
  xmlRelaxNGDefinePtr pxVar5;
  xmlRelaxNGDefinePtr pxVar6;
  int iVar7;
  int iVar8;
  xmlRelaxNGDefinePtr_conflict *ppxVar9;
  
  iVar8 = 0;
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0 || ctxt->nbErrors != 0) {
    return (xmlRelaxNGDefinePtr_conflict *)0x0;
  }
  iVar7 = 0;
  ppxVar9 = (xmlRelaxNGDefinePtr_conflict *)0x0;
  pxVar3 = def;
  do {
    while (pxVar6 = pxVar3, xVar2 = pxVar6->type, eora == 2) {
      if ((8 < (uint)xVar2) ||
         ((0x1b8U >> (xVar2 & (XML_RELAXNG_ONEORMORE|XML_RELAXNG_ZEROORMORE)) & 1) == 0))
      goto LAB_00176053;
LAB_0017607a:
      if (ppxVar9 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
        ppxVar4 = (xmlRelaxNGDefinePtr_conflict *)(*xmlMalloc)(0x58);
        if (ppxVar4 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
          xmlRngPErrMemory(ctxt,"getting element list\n");
          return (xmlRelaxNGDefinePtr_conflict *)0x0;
        }
        iVar8 = 10;
      }
      else {
        ppxVar4 = ppxVar9;
        if (iVar8 <= iVar7) {
          ppxVar4 = (xmlRelaxNGDefinePtr_conflict *)
                    (*xmlRealloc)(ppxVar9,(long)(iVar8 * 2 + 1) << 3);
          if (ppxVar4 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
            xmlRngPErrMemory(ctxt,"getting element list\n");
            (*xmlFree)(ppxVar9);
            return (xmlRelaxNGDefinePtr_conflict *)0x0;
          }
          iVar8 = iVar8 * 2;
        }
      }
      ppxVar4[iVar7] = pxVar6;
      ppxVar4[(long)iVar7 + 1] = (xmlRelaxNGDefinePtr_conflict)0x0;
      ppxVar9 = ppxVar4;
      iVar7 = iVar7 + 1;
LAB_001760e0:
      while( true ) {
        if (pxVar6 == def) {
          return ppxVar9;
        }
        pxVar3 = pxVar6->next;
        if (pxVar6->next != (xmlRelaxNGDefinePtr)0x0) break;
        pxVar6 = pxVar6->parent;
        if (pxVar6 == (xmlRelaxNGDefinePtr)0x0) {
          return ppxVar9;
        }
      }
    }
    if (eora == 1) {
      if (xVar2 != XML_RELAXNG_ATTRIBUTE) goto LAB_00176053;
      goto LAB_0017607a;
    }
    if ((eora == 0) && ((uint)(xVar2 + ~XML_RELAXNG_EXCEPT) < 2)) goto LAB_0017607a;
LAB_00176053:
    if ((9 < (uint)(xVar2 + ~XML_RELAXNG_ATTRIBUTE)) ||
       (pxVar3 = pxVar6->content, pxVar5 = pxVar3, pxVar3 == (xmlRelaxNGDefinePtr)0x0))
    goto LAB_001760e0;
    do {
      pxVar5->parent = pxVar6;
      ppxVar1 = &pxVar5->next;
      pxVar5 = *ppxVar1;
    } while (*ppxVar1 != (xmlRelaxNGDefinePtr)0x0);
  } while( true );
}

Assistant:

static xmlRelaxNGDefinePtr *
xmlRelaxNGGetElements(xmlRelaxNGParserCtxtPtr ctxt,
                      xmlRelaxNGDefinePtr def, int eora)
{
    xmlRelaxNGDefinePtr *ret = NULL, parent, cur, tmp;
    int len = 0;
    int max = 0;

    /*
     * Don't run that check in case of error. Infinite recursion
     * becomes possible.
     */
    if (ctxt->nbErrors != 0)
        return (NULL);

    parent = NULL;
    cur = def;
    while (cur != NULL) {
        if (((eora == 0) && ((cur->type == XML_RELAXNG_ELEMENT) ||
                             (cur->type == XML_RELAXNG_TEXT))) ||
            ((eora == 1) && (cur->type == XML_RELAXNG_ATTRIBUTE)) ||
            ((eora == 2) && ((cur->type == XML_RELAXNG_DATATYPE) ||
	                     (cur->type == XML_RELAXNG_ELEMENT) ||
			     (cur->type == XML_RELAXNG_LIST) ||
                             (cur->type == XML_RELAXNG_TEXT) ||
			     (cur->type == XML_RELAXNG_VALUE)))) {
            if (ret == NULL) {
                max = 10;
                ret = (xmlRelaxNGDefinePtr *)
                    xmlMalloc((max + 1) * sizeof(xmlRelaxNGDefinePtr));
                if (ret == NULL) {
                    xmlRngPErrMemory(ctxt, "getting element list\n");
                    return (NULL);
                }
            } else if (max <= len) {
	        xmlRelaxNGDefinePtr *temp;

                max *= 2;
                temp = xmlRealloc(ret,
                               (max + 1) * sizeof(xmlRelaxNGDefinePtr));
                if (temp == NULL) {
                    xmlRngPErrMemory(ctxt, "getting element list\n");
		    xmlFree(ret);
                    return (NULL);
                }
		ret = temp;
            }
            ret[len++] = cur;
            ret[len] = NULL;
        } else if ((cur->type == XML_RELAXNG_CHOICE) ||
                   (cur->type == XML_RELAXNG_INTERLEAVE) ||
                   (cur->type == XML_RELAXNG_GROUP) ||
                   (cur->type == XML_RELAXNG_ONEORMORE) ||
                   (cur->type == XML_RELAXNG_ZEROORMORE) ||
                   (cur->type == XML_RELAXNG_OPTIONAL) ||
                   (cur->type == XML_RELAXNG_PARENTREF) ||
                   (cur->type == XML_RELAXNG_REF) ||
                   (cur->type == XML_RELAXNG_DEF) ||
		   (cur->type == XML_RELAXNG_EXTERNALREF)) {
            /*
             * Don't go within elements or attributes or string values.
             * Just gather the element top list
             */
            if (cur->content != NULL) {
                parent = cur;
                cur = cur->content;
                tmp = cur;
                while (tmp != NULL) {
                    tmp->parent = parent;
                    tmp = tmp->next;
                }
                continue;
            }
        }
        if (cur == def)
            break;
        if (cur->next != NULL) {
            cur = cur->next;
            continue;
        }
        do {
            cur = cur->parent;
            if (cur == NULL)
                break;
            if (cur == def)
                return (ret);
            if (cur->next != NULL) {
                cur = cur->next;
                break;
            }
        } while (cur != NULL);
    }
    return (ret);
}